

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_dispatch.cpp
# Opt level: O1

void Cmd_cmdlist(FCommandLine *argv,APlayerPawn *who,int key)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  char *pattern;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *pattern_00;
  int count;
  long lVar4;
  char matcher [16];
  char acStack_48 [24];
  
  iVar2 = FCommandLine::argc(argv);
  if (iVar2 == 1) {
    pattern = (char *)0x0;
  }
  else {
    pattern = FCommandLine::operator[](argv,1);
  }
  lVar4 = 0xc;
  iVar2 = 0;
  do {
    if (pattern == (char *)0x0) {
LAB_0047d57e:
      Printf("+%s\n",ActionMaps[0].Name + lVar4 + -0xc);
      iVar2 = iVar2 + 1;
    }
    else {
      mysnprintf(acStack_48,0x10,"+%s",ActionMaps[0].Name + lVar4 + -0xc);
      bVar1 = CheckWildcards(pattern,acStack_48);
      if (bVar1) goto LAB_0047d57e;
    }
    if (pattern == (char *)0x0) {
LAB_0047d5c0:
      Printf("-%s\n",ActionMaps[0].Name + lVar4 + -0xc);
      iVar2 = iVar2 + 1;
      pattern_00 = extraout_RDX_00;
    }
    else {
      mysnprintf(acStack_48,0x10,"-%s",ActionMaps[0].Name + lVar4 + -0xc);
      bVar1 = CheckWildcards(pattern,acStack_48);
      pattern_00 = extraout_RDX;
      if (bVar1) goto LAB_0047d5c0;
    }
    lVar4 = lVar4 + 0x18;
    if (lVar4 == 0x30c) {
      iVar3 = DumpHash((FConsoleCommand **)0x0,SUB81(pattern,0),pattern_00);
      Printf("%d commands\n",(ulong)(uint)(iVar2 + iVar3));
      return;
    }
  } while( true );
}

Assistant:

CCMD (cmdlist)
{
	int count;
	const char *filter = (argv.argc() == 1 ? NULL : argv[1]);

	count = ListActionCommands (filter);
	count += DumpHash (Commands, false, filter);
	Printf ("%d commands\n", count);
}